

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O2

void stripctrl_term_put_wc(StripCtrlCharsImpl *scc,unsigned_long wc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  undefined8 in_RAX;
  size_t len;
  uint c;
  ulong uVar3;
  char *pcVar4;
  ptrlen pl;
  undefined2 uStack_28;
  char outbuf [6];
  
  c = (uint)wc;
  _uStack_28 = in_RAX;
  wVar1 = term_char_width(scc->term,c);
  if (wVar1 < L'\0' || (wc & 0xffffffffffffff60) == 0) {
    if ((c == 10) || ((c == 0xd && (scc->permit_cr != false)))) {
      wVar2 = L'\0';
      if (L'\0' < wVar1) {
        wVar2 = wVar1;
      }
    }
    else {
      wc = (unsigned_long)scc->substitution;
      if (wc == 0) {
        return;
      }
      wVar2 = term_char_width(scc->term,scc->substitution);
      if (wVar2 < L'\0') {
        __assert_fail("width >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,199,"void stripctrl_term_put_wc(StripCtrlCharsImpl *, unsigned long)");
      }
    }
    uVar3 = (ulong)(wc == 10);
    pcVar4 = anon_var_dwarf_331ec + 10;
    wVar1 = wVar2;
    if (wc == 10) {
      pcVar4 = "\r";
    }
  }
  else {
    pcVar4 = anon_var_dwarf_331ec + 10;
    uVar3 = 0;
  }
  stripctrl_check_line_limit(scc,(wchar_t)wc,(ulong)(uint)wVar1);
  if (uVar3 != 0) {
    pl.len = uVar3;
    pl.ptr = pcVar4;
    BinarySink_put_datapl(scc->bs_out->binarysink_,pl);
  }
  uVar3 = wc & 0xff;
  if ((wc & 0xfffffffffffff800) != 0xd800) {
    uVar3 = wc;
  }
  if ((scc->term->utf == false) && (scc->term->ucsdata->line_codepage != L'7')) {
    _uStack_28 = CONCAT12((char)uVar3,uStack_28);
    len = 1;
  }
  else {
    len = encode_utf8(outbuf,uVar3);
    if (len == 0) {
      return;
    }
  }
  BinarySink_put_data(scc->bs_out->binarysink_,outbuf,len);
  return;
}

Assistant:

static inline void stripctrl_term_put_wc(
    StripCtrlCharsImpl *scc, unsigned long wc)
{
    ptrlen prefix = PTRLEN_LITERAL("");
    int width = term_char_width(scc->term, wc);

    if (!(wc & ~0x9F) || width < 0) {
        /* This is something the terminal interprets as a control
         * character. */
        if (!stripctrl_ctrlchar_ok(scc, wc)) {
            if (!scc->substitution) {
                return;
            } else {
                wc = scc->substitution;
                width = term_char_width(scc->term, wc);
                assert(width >= 0);
            }
        } else {
            if (width < 0)
                width = 0; /* sanitise for stripctrl_check_line_limit */
        }

        if (wc == '\012') {
            /* Precede \n with \r, because our terminal will not
             * generally be in the ONLCR mode where it assumes that
             * internally, and any \r on input has been stripped
             * out. */
            prefix = PTRLEN_LITERAL("\r");
        }
    }

    stripctrl_check_line_limit(scc, wc, width);

    if (prefix.len)
        put_datapl(scc->bs_out, prefix);

    char outbuf[6];
    size_t produced;

    /*
     * The Terminal implementation encodes 7-bit ASCII characters in
     * UTF-8 mode, and all printing characters in non-UTF-8 (i.e.
     * single-byte character set) mode, as values in the surrogate
     * range (a conveniently unused piece of space in this context)
     * whose low byte is the original 1-byte representation of the
     * character.
     */
    if ((wc - 0xD800) < (0xE000 - 0xD800))
        wc &= 0xFF;

    if (in_utf(scc->term)) {
        produced = encode_utf8(outbuf, wc);
    } else {
        outbuf[0] = wc;
        produced = 1;
    }

    if (produced > 0)
        put_data(scc->bs_out, outbuf, produced);
}